

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

void yy_2_paren_args(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = PVIP_node_new_children(&G->data,PVIP_NODE_ARGS);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_2_paren_args(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define a G->val[-1]
  yyprintf((stderr, "do yy_2_paren_args"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy = PVIP_node_new_children(&(G->data), PVIP_NODE_ARGS); }\n"));
  yy = PVIP_node_new_children(&(G->data), PVIP_NODE_ARGS); ;
#undef a
}